

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Allocate(BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,int **ppBuckets,EntryType **ppEntries,uint bucketCount,int size)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  int *__s;
  EntryType *__s_00;
  size_t requestedBytes;
  
  if (bucketCount == 0) {
    __s = (int *)&DAT_00000008;
  }
  else {
    pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00ea7395;
      *puVar5 = 0;
    }
    __s = (int *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(pAVar1,(ulong)bucketCount * 4);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00ea7395;
      *puVar5 = 0;
    }
  }
  if (__s == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x46b,"(buckets)","buckets");
    if (!bVar3) goto LAB_00ea7395;
    *puVar5 = 0;
  }
  if (size == 0) {
    __s_00 = (EntryType *)&DAT_00000008;
  }
  else {
    pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    requestedBytes = 0xffffffffffffffff;
    if (-1 < size) {
      requestedBytes = (long)size << 4;
    }
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00ea7395;
      *puVar5 = 0;
    }
    __s_00 = (EntryType *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(pAVar1,requestedBytes);
    memset(__s_00,0,requestedBytes);
    memset((char *)((long)&(__s_00->
                           super_DefaultHashedEntry<Ident_*,_Ident_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                           ).super_ImplicitKeyValueEntry<Ident_*,_Ident_*>.
                           super_ValueEntry<Ident_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Ident_*>_>
                           .super_ValueEntryData<Ident_*>.value + requestedBytes),0,
           (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
    if (__s_00 == (EntryType *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00ea7395;
      *puVar5 = 0;
    }
  }
  if (__s_00 == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x471,"(entries)","entries");
    if (!bVar3) {
LAB_00ea7395:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  memset(__s,0xff,(ulong)bucketCount << 2);
  *ppBuckets = __s;
  *ppEntries = __s_00;
  return;
}

Assistant:

void Allocate(__deref_out_ecount(bucketCount) int** ppBuckets, __deref_out_ecount(size) EntryType** ppEntries, DECLSPEC_GUARD_OVERFLOW uint bucketCount, DECLSPEC_GUARD_OVERFLOW int size)
        {
            int *const buckets = AllocateBuckets(bucketCount);
            Assert(buckets); // no-throw allocators are currently not supported

            EntryType *entries;
            try
            {
                entries = AllocateEntries(size);
                Assert(entries); // no-throw allocators are currently not supported
            }
            catch(...)
            {
                DeleteBuckets(buckets, bucketCount);
                throw;
            }

            memset(buckets, -1, bucketCount * sizeof(buckets[0]));

            *ppBuckets = buckets;
            *ppEntries = entries;
        }